

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void random_fill<eumorphic::ordered_collection<container,A,B,C,D,CA,CB>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_int_distribution<int>,std::uniform_real_distribution<double>>
               (ordered_collection<container,_A,_B,_C,_D,_CA,_CB> *container,
               mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
               *gen,uniform_int_distribution<int> *rnd_type,uniform_real_distribution<double> *rnd,
               size_t count)

{
  result_type rVar1;
  bool bVar2;
  
  while (bVar2 = count != 0, count = count - 1, bVar2) {
    rVar1 = std::uniform_int_distribution<int>::operator()(rnd_type,gen);
    switch(rVar1) {
    case 0:
      insert_rnd_value_of<A,eumorphic::ordered_collection<container,A,B,C,D,CA,CB>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
                (container,gen,rnd);
      break;
    case 1:
      insert_rnd_value_of<B,eumorphic::ordered_collection<container,A,B,C,D,CA,CB>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
                (container,gen,rnd);
      break;
    case 2:
      insert_rnd_value_of<C,eumorphic::ordered_collection<container,A,B,C,D,CA,CB>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
                (container,gen,rnd);
      break;
    case 3:
      insert_rnd_value_of<D,eumorphic::ordered_collection<container,A,B,C,D,CA,CB>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
                (container,gen,rnd);
      break;
    case 4:
      insert_rnd_value_of<CA,eumorphic::ordered_collection<container,A,B,C,D,CA,CB>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
                (container,gen,rnd);
      break;
    case 5:
      insert_rnd_value_of<CB,eumorphic::ordered_collection<container,A,B,C,D,CA,CB>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>,std::uniform_real_distribution<double>>
                (container,gen,rnd);
    }
  }
  return;
}

Assistant:

void random_fill(Cont&container, E& gen, R1& rnd_type, R2& rnd, std::size_t count )
{
	for ( std::size_t i = 0; i != count; i++)
        {
            switch (rnd_type(gen))
		{
                        case 0: insert_rnd_value_of<A> (container, gen, rnd); break;
                        case 1: insert_rnd_value_of<B> (container, gen, rnd); break;
                        case 2: insert_rnd_value_of<C> (container, gen, rnd); break;
                        case 3: insert_rnd_value_of<D> (container, gen, rnd); break;
			case 4: insert_rnd_value_of<CA>(container, gen, rnd); break;
			case 5: insert_rnd_value_of<CB>(container, gen, rnd); break;
		}
	}
}